

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O0

void sys_exithandler(int n)

{
  int n_local;
  
  if (sys_exithandler::trouble == 0) {
    sys_exithandler::trouble = 1;
    fprintf(_stderr,"Pd: signal %d\n",(ulong)(uint)n);
    sys_bail(1);
    return;
  }
  _exit(1);
}

Assistant:

static void sys_exithandler(int n)
{
    static int trouble = 0;
    if (!trouble)
    {
        trouble = 1;
        fprintf(stderr, "Pd: signal %d\n", n);
        sys_bail(1);
    }
    else _exit(1);
}